

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.c
# Opt level: O0

uint8_t * VP8BitWriterFinish(VP8BitWriter *bw)

{
  long in_RDI;
  VP8BitWriter *in_stack_00000010;
  
  VP8PutBits(bw,(uint32_t)((ulong)in_RDI >> 0x20),(int)in_RDI);
  *(undefined4 *)(in_RDI + 0xc) = 0;
  Flush(in_stack_00000010);
  return *(uint8_t **)(in_RDI + 0x10);
}

Assistant:

uint8_t* VP8BitWriterFinish(VP8BitWriter* const bw) {
  VP8PutBits(bw, 0, 9 - bw->nb_bits_);
  bw->nb_bits_ = 0;   // pad with zeroes
  Flush(bw);
  return bw->buf_;
}